

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O3

bool __thiscall QAction::event(QAction *this,QEvent *e)

{
  long lVar1;
  long lVar2;
  undefined1 uVar3;
  short sVar4;
  long lVar5;
  
  sVar4 = *(short *)(e + 8);
  if (sVar4 == 0x71) {
    lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x150);
    if (lVar1 == 0) goto LAB_0058effe;
    lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x148);
    lVar5 = 0;
    do {
      QCoreApplication::sendEvent(*(QObject **)(lVar2 + lVar5),e);
      lVar5 = lVar5 + 8;
    } while (lVar1 << 3 != lVar5);
    sVar4 = *(short *)(e + 8);
  }
  if (sVar4 == 0x75) {
    if (e[0x1c] == (QEvent)0x1) {
      event((QAction *)e);
    }
    else {
      activate(this,Trigger);
    }
    return true;
  }
LAB_0058effe:
  uVar3 = QObject::event((QEvent *)this);
  return (bool)uVar3;
}

Assistant:

bool QAction::event(QEvent *e)
{
    Q_D(QAction);
    if (e->type() == QEvent::ActionChanged) {
        for (auto object : std::as_const(d->associatedObjects))
            QCoreApplication::sendEvent(object, e);
    }

#if QT_CONFIG(shortcut)
    if (e->type() == QEvent::Shortcut) {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        Q_ASSERT_X(d_func()->shortcutIds.contains(se->shortcutId()),
                   "QAction::event",
                   "Received shortcut event from incorrect shortcut");
        if (se->isAmbiguous())
            qWarning("QAction::event: Ambiguous shortcut overload: %s", se->key().toString(QKeySequence::NativeText).toLatin1().constData());
        else
            activate(Trigger);
        return true;
    }
#endif // QT_CONFIG(shortcut)
    return QObject::event(e);
}